

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2310ac1::entry_to_remove::entry_to_remove
          (entry_to_remove *this,string *name,cmMakefile *makefile)

{
  cmValue cVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  this->count = -1;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  local_48 = (name->_M_dataplus)._M_p;
  local_50 = name->_M_string_length;
  local_60._M_len = 0x1a;
  local_60._M_str = "_CMAKE_SYSTEM_PREFIX_PATH_";
  local_40 = 0xd;
  local_38 = "_PREFIX_COUNT";
  views._M_len = 3;
  views._M_array = &local_60;
  cmCatViews_abi_cxx11_(&local_80,views);
  cVar1 = cmMakefile::GetDefinition(makefile,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (cVar1.Value != (string *)0x0) {
    cmStrToLong(cVar1.Value,&this->count);
  }
  local_48 = (name->_M_dataplus)._M_p;
  local_50 = name->_M_string_length;
  local_60._M_len = 0x1a;
  local_60._M_str = "_CMAKE_SYSTEM_PREFIX_PATH_";
  local_40 = 0xd;
  local_38 = "_PREFIX_VALUE";
  views_00._M_len = 3;
  views_00._M_array = &local_60;
  cmCatViews_abi_cxx11_(&local_80,views_00);
  cVar1 = cmMakefile::GetDefinition(makefile,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->value);
  }
  return;
}

Assistant:

entry_to_remove(std::string const& name, cmMakefile* makefile)
    : value()
  {
    if (cmValue to_skip = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_COUNT"))) {
      cmStrToLong(to_skip, &count);
    }
    if (cmValue prefix_value = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_VALUE"))) {
      value = *prefix_value;
    }
  }